

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O2

int __thiscall
OSSLECDSA::verify(OSSLECDSA *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
                 size_t tbslen)

{
  char cVar1;
  int iVar2;
  EC_KEY *eckey;
  undefined8 uVar3;
  long lVar4;
  size_t sVar5;
  ECDSA_SIG *sig_00;
  uchar *s;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  uchar *dgst;
  ulong uVar8;
  char *format;
  
  if ((int)tbs == 0x17) {
    cVar1 = (**(code **)(*(long *)ctx + 0x18))(ctx,OSSLECPublicKey::type);
    if (cVar1 == '\0') {
      format = "Invalid key type supplied";
      iVar2 = 0x9d;
    }
    else {
      eckey = OSSLECPublicKey::getOSSLKey((OSSLECPublicKey *)ctx);
      if (eckey == (EC_KEY *)0x0) {
        format = "Could not get the OpenSSL public key";
        iVar2 = 0xa7;
      }
      else {
        uVar3 = EC_KEY_OpenSSL();
        EC_KEY_set_method(eckey,uVar3);
        lVar4 = (**(code **)(*(long *)ctx + 0x30))(ctx);
        if (lVar4 == 0) {
          format = "Could not get the order length";
          iVar2 = 0xc0;
        }
        else {
          sVar5 = ByteString::size((ByteString *)siglen);
          if (sVar5 == lVar4 * 2) {
            sig_00 = ECDSA_SIG_new();
            if (sig_00 != (ECDSA_SIG *)0x0) {
              s = ByteString::const_byte_str((ByteString *)siglen);
              pBVar6 = BN_bin2bn(s,(int)lVar4,(BIGNUM *)0x0);
              pBVar7 = BN_bin2bn(s + lVar4,(int)lVar4,(BIGNUM *)0x0);
              if ((pBVar7 != (BIGNUM *)0x0 && pBVar6 != (BIGNUM *)0x0) &&
                 (iVar2 = ECDSA_SIG_set0(sig_00,pBVar6,pBVar7), iVar2 != 0)) {
                dgst = ByteString::const_byte_str((ByteString *)sig);
                sVar5 = ByteString::size((ByteString *)sig);
                iVar2 = ECDSA_do_verify(dgst,(int)sVar5,sig_00,(EC_KEY *)eckey);
                if (iVar2 == 1) {
                  ECDSA_SIG_free(sig_00);
                  return (int)CONCAT71((int7)((ulong)(s + lVar4) >> 8),1);
                }
                if (iVar2 < 0) {
                  uVar8 = ERR_get_error();
                  softHSMLog(3,"verify",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                             ,0xdc,"ECDSA verify failed (0x%08X)",uVar8);
                }
                ECDSA_SIG_free(sig_00);
                return 0;
              }
              softHSMLog(3,"verify",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                         ,0xd4,"Could not add data to the ECDSA_SIG object");
              ECDSA_SIG_free(sig_00);
              return 0;
            }
            format = "Could not create an ECDSA_SIG object";
            iVar2 = 0xcb;
          }
          else {
            format = "Invalid buffer length";
            iVar2 = 0xc5;
          }
        }
      }
    }
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,iVar2,format);
  }
  else {
    softHSMLog(3,"verify",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,0x96,"Invalid mechanism supplied (%i)",(ulong)tbs & 0xffffffff);
  }
  return 0;
}

Assistant:

bool OSSLECDSA::verify(PublicKey* publicKey, const ByteString& originalData,
		       const ByteString& signature, const AsymMech::Type mechanism,
		       const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if (mechanism != AsymMech::ECDSA)
	{
		ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);
		return false;
	}

	// Check if the private key is the right type
	if (!publicKey->isOfType(OSSLECPublicKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		return false;
	}

	OSSLECPublicKey* pk = (OSSLECPublicKey*) publicKey;
	EC_KEY* eckey = pk->getOSSLKey();

	if (eckey == NULL)
	{
		ERROR_MSG("Could not get the OpenSSL public key");

		return false;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		ECDSA_set_method(eckey, FIPS_ecdsa_openssl());
	else
		ECDSA_set_method(eckey, ECDSA_OpenSSL());
#else
	ECDSA_set_method(eckey, ECDSA_OpenSSL());
#endif

#else
	EC_KEY_set_method(eckey, EC_KEY_OpenSSL());
#endif

	// Perform the verify operation
	size_t len = pk->getOrderLength();
	if (len == 0)
	{
		ERROR_MSG("Could not get the order length");
		return false;
	}
	if (signature.size() != 2 * len)
	{
		ERROR_MSG("Invalid buffer length");
		return false;
	}
	ECDSA_SIG* sig = ECDSA_SIG_new();
	if (sig == NULL)
	{
		ERROR_MSG("Could not create an ECDSA_SIG object");
		return false;
	}
	const unsigned char *s = signature.const_byte_str();
	BIGNUM* bn_r = BN_bin2bn(s, len, NULL);
	BIGNUM* bn_s = BN_bin2bn(s + len, len, NULL);
	if (bn_r == NULL || bn_s == NULL ||
	    !ECDSA_SIG_set0(sig, bn_r, bn_s))
	{
		ERROR_MSG("Could not add data to the ECDSA_SIG object");
		ECDSA_SIG_free(sig);
		return false;
	}
	int ret = ECDSA_do_verify(originalData.const_byte_str(), originalData.size(), sig, eckey);
	if (ret != 1)
	{
		if (ret < 0)
			ERROR_MSG("ECDSA verify failed (0x%08X)", ERR_get_error());

		ECDSA_SIG_free(sig);
		return false;
	}

	ECDSA_SIG_free(sig);
	return true;
}